

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-common.cpp
# Opt level: O0

void __thiscall
Dashel::DashelException::DashelException
          (DashelException *this,Source s,int se,char *reason,Stream *stream)

{
  int se_00;
  string local_f8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  Stream *local_28;
  Stream *stream_local;
  char *reason_local;
  int se_local;
  Source s_local;
  DashelException *this_local;
  
  local_28 = stream;
  stream_local = (Stream *)reason;
  reason_local._0_4_ = se;
  reason_local._4_4_ = s;
  _se_local = this;
  sourceToString_abi_cxx11_(&local_c8,(DashelException *)(ulong)s,se);
  std::operator+(&local_a8,&local_c8," (");
  _to_string_abi_cxx11_(&local_f8,(Dashel *)(ulong)(uint)reason_local,se_00);
  std::operator+(&local_88,&local_a8,&local_f8);
  std::operator+(&local_68,&local_88,"): ");
  std::operator+(&local_48,&local_68,(char *)stream_local);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  *(undefined ***)this = &PTR__DashelException_00152ab8;
  this->source = reason_local._4_4_;
  this->sysError = (uint)reason_local;
  this->stream = local_28;
  return;
}

Assistant:

DashelException::DashelException(Source s, int se, const char* reason, Stream* stream) :
		std::runtime_error(sourceToString(s) + " (" + _to_string(se) + "): " + reason),
		source(s),
		sysError(se),
		stream(stream)
	{
	}